

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::anon_unknown_0::EncodeResult<float>
          (anon_unknown_0 *this,CalculatedFloat *calculated,bool negative,
          Nonnull<absl::from_chars_result_*> result,Nonnull<float_*> value)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  iVar2 = (int)calculated;
  if (iVar2 == 99999) {
    result->ec = result_out_of_range;
    if (negative) {
      fVar3 = -3.4028235e+38;
    }
    else {
      fVar3 = 3.4028235e+38;
    }
  }
  else {
    if (this != (anon_unknown_0 *)0x0 && iVar2 != -99999) {
      iVar1 = (uint)negative * -0x80000000;
      if ((uint)this < 0x800000) {
        if (iVar2 != -0x95) {
          __assert_fail("exponent == kMinNormalExponent",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/charconv.cc"
                        ,0xe6,
                        "static float absl::lts_20250127::(anonymous namespace)::FloatTraits<float>::Make(mantissa_t, int, bool)"
                       );
        }
      }
      else {
        iVar1 = iVar1 + iVar2 * 0x800000 + 0x4b000000;
        this = (anon_unknown_0 *)(ulong)((uint)this & 0x7fffff);
      }
      *value = (float)(iVar1 + (int)this);
      return;
    }
    result->ec = result_out_of_range;
    if (negative) {
      fVar3 = -0.0;
    }
    else {
      fVar3 = 0.0;
    }
  }
  *value = fVar3;
  return;
}

Assistant:

void EncodeResult(const CalculatedFloat& calculated, bool negative,
                  absl::Nonnull<absl::from_chars_result*> result,
                  absl::Nonnull<FloatType*> value) {
  if (calculated.exponent == kOverflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    return;
  } else if (calculated.mantissa == 0 || calculated.exponent == kUnderflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -0.0 : 0.0;
    return;
  }
  *value = FloatTraits<FloatType>::Make(
      static_cast<typename FloatTraits<FloatType>::mantissa_t>(
          calculated.mantissa),
      calculated.exponent, negative);
}